

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Functional::VertexIDCase::init(VertexIDCase *this,EVP_PKEY_CTX *ctx)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this_00;
  float *pfVar1;
  RenderContext *renderCtx;
  pointer pVVar2;
  byte bVar3;
  int iVar4;
  int extraout_EAX;
  undefined4 extraout_var;
  RenderTarget *pRVar5;
  ShaderProgram *pSVar6;
  NotSupportedError *pNVar7;
  TestError *this_01;
  bool bVar8;
  uint uVar9;
  long lVar10;
  int vtxNdx;
  ulong uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  allocator<char> local_15a;
  allocator<char> local_159;
  string local_158;
  int local_138;
  int iStack_134;
  undefined8 uStack_130;
  string local_120;
  ProgramSources local_100;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar12 = pRVar5->m_width;
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((int)uVar12 < 0x20) {
    pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"Too small render target",(allocator<char> *)&local_158);
    tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)&local_100);
    __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  uVar12 = uVar12 >> 5;
  uVar9 = 4;
  if (uVar12 < 4) {
    uVar9 = uVar12;
  }
  local_138 = uVar9 << 5;
  iStack_134 = (((int)(4 / (ulong)uVar12) + 1) - (uint)((int)(4 % (ulong)uVar12) == 0)) * 0x20;
  uStack_130 = 0;
  if (iStack_134 <= pRVar5->m_height) {
    pSVar6 = (ShaderProgram *)operator_new(0xd0);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,
               "#version 300 es\nin highp vec4 a_position;\nout mediump vec4 v_color;\nuniform highp vec4 u_colors[24];\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = u_colors[gl_VertexID];\n}\n"
               ,&local_159);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,
               "#version 300 es\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = v_color;\n}\n"
               ,&local_15a);
    glu::makeVtxFragSources(&local_100,&local_158,&local_120);
    glu::ShaderProgram::ShaderProgram(pSVar6,renderCtx,&local_100);
    this->m_program = pSVar6;
    glu::ProgramSources::~ProgramSources(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_158);
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    this->m_program);
    pSVar6 = this->m_program;
    if ((pSVar6->m_program).m_info.linkOk != false) {
      (**(code **)(CONCAT44(extraout_var,iVar4) + 0x6c8))(1,&this->m_positionBuffer);
      (**(code **)(CONCAT44(extraout_var,iVar4) + 0x6c8))(1,&this->m_elementBuffer);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&this->m_colors,0x18);
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2->m_data[0] = 0.0;
      pVVar2->m_data[1] = 0.0;
      pVVar2->m_data[2] = 0.0;
      pVVar2->m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[1].m_data[0] = 0.5;
      pVVar2[1].m_data[1] = 1.0;
      pVVar2[1].m_data[2] = 0.5;
      pVVar2[1].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[2].m_data[0] = 0.0;
      pVVar2[2].m_data[1] = 0.5;
      pVVar2[2].m_data[2] = 1.0;
      pVVar2[2].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[3].m_data[0] = 0.0;
      pVVar2[3].m_data[1] = 1.0;
      pVVar2[3].m_data[2] = 0.0;
      pVVar2[3].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[4].m_data[0] = 0.0;
      pVVar2[4].m_data[1] = 1.0;
      pVVar2[4].m_data[2] = 1.0;
      pVVar2[4].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[5].m_data[0] = 0.5;
      pVVar2[5].m_data[1] = 0.0;
      pVVar2[5].m_data[2] = 0.0;
      pVVar2[5].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[6].m_data[0] = 0.5;
      pVVar2[6].m_data[1] = 0.0;
      pVVar2[6].m_data[2] = 1.0;
      pVVar2[6].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[7].m_data[0] = 0.5;
      pVVar2[7].m_data[1] = 0.0;
      pVVar2[7].m_data[2] = 0.5;
      pVVar2[7].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[8].m_data[0] = 1.0;
      pVVar2[8].m_data[1] = 0.0;
      pVVar2[8].m_data[2] = 0.0;
      pVVar2[8].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[9].m_data[0] = 0.5;
      pVVar2[9].m_data[1] = 1.0;
      pVVar2[9].m_data[2] = 0.0;
      pVVar2[9].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[10].m_data[0] = 0.0;
      pVVar2[10].m_data[1] = 0.5;
      pVVar2[10].m_data[2] = 0.0;
      pVVar2[10].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0xb].m_data[0] = 0.5;
      pVVar2[0xb].m_data[1] = 1.0;
      pVVar2[0xb].m_data[2] = 1.0;
      pVVar2[0xb].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0xc].m_data[0] = 0.0;
      pVVar2[0xc].m_data[1] = 0.0;
      pVVar2[0xc].m_data[2] = 1.0;
      pVVar2[0xc].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0xd].m_data[0] = 1.0;
      pVVar2[0xd].m_data[1] = 0.0;
      pVVar2[0xd].m_data[2] = 0.5;
      pVVar2[0xd].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0xe].m_data[0] = 0.0;
      pVVar2[0xe].m_data[1] = 0.5;
      pVVar2[0xe].m_data[2] = 0.5;
      pVVar2[0xe].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0xf].m_data[0] = 1.0;
      pVVar2[0xf].m_data[1] = 1.0;
      pVVar2[0xf].m_data[2] = 0.5;
      pVVar2[0xf].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x10].m_data[0] = 1.0;
      pVVar2[0x10].m_data[1] = 0.0;
      pVVar2[0x10].m_data[2] = 1.0;
      pVVar2[0x10].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x11].m_data[0] = 1.0;
      pVVar2[0x11].m_data[1] = 0.5;
      pVVar2[0x11].m_data[2] = 0.0;
      pVVar2[0x11].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x12].m_data[0] = 0.0;
      pVVar2[0x12].m_data[1] = 1.0;
      pVVar2[0x12].m_data[2] = 0.5;
      pVVar2[0x12].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x13].m_data[0] = 1.0;
      pVVar2[0x13].m_data[1] = 0.5;
      pVVar2[0x13].m_data[2] = 1.0;
      pVVar2[0x13].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x14].m_data[0] = 1.0;
      pVVar2[0x14].m_data[1] = 1.0;
      pVVar2[0x14].m_data[2] = 0.0;
      pVVar2[0x14].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x15].m_data[0] = 1.0;
      pVVar2[0x15].m_data[1] = 0.5;
      pVVar2[0x15].m_data[2] = 0.5;
      pVVar2[0x15].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x16].m_data[0] = 0.0;
      pVVar2[0x16].m_data[1] = 0.0;
      pVVar2[0x16].m_data[2] = 0.5;
      pVVar2[0x16].m_data[3] = 1.0;
      pVVar2 = (this->m_colors).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[0x17].m_data[0] = 1.0;
      pVVar2[0x17].m_data[1] = 1.0;
      pVVar2[0x17].m_data[2] = 1.0;
      pVVar2[0x17].m_data[3] = 1.0;
      this_00 = &this->m_positions;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (this_00,0x18);
      auVar13._0_4_ = (float)local_138;
      auVar13._4_4_ = (float)iStack_134;
      auVar13._8_4_ = (float)(int)uStack_130;
      auVar13._12_4_ = (float)uStack_130._4_4_;
      auVar13 = divps(_DAT_018402d0,auVar13);
      bVar8 = false;
      lVar10 = 0;
      for (uVar11 = 0; uVar11 < 0x18; uVar11 = uVar11 + 3) {
        bVar3 = (byte)(((ushort)uVar11 & 0xff) / 6);
        fVar16 = (float)((uint)bVar3 % uVar12) * auVar13._0_4_ + -1.0;
        fVar17 = (float)(bVar3 / uVar12) * auVar13._4_4_ + -1.0;
        fVar14 = auVar13._0_4_ + fVar16;
        fVar15 = auVar13._4_4_ + fVar17;
        if (bVar8) {
          pfVar1 = (float *)((long)((this_00->
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10);
          *pfVar1 = fVar14;
          pfVar1[1] = fVar15;
          pfVar1[2] = 0.0;
          pfVar1[3] = 1.0;
          fVar18 = fVar14;
        }
        else {
          pfVar1 = (float *)((long)((this_00->
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10);
          *pfVar1 = fVar16;
          pfVar1[1] = fVar17;
          pfVar1[2] = 0.0;
          pfVar1[3] = 1.0;
          fVar18 = fVar16;
          fVar16 = fVar14;
          fVar17 = fVar15;
        }
        pfVar1 = (float *)((long)(this_00->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar10);
        *pfVar1 = fVar16;
        pfVar1[1] = fVar17;
        pfVar1[2] = 0.0;
        pfVar1[3] = 1.0;
        pVVar2 = (this_00->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        *(float *)((long)pVVar2[2].m_data + lVar10) = fVar18;
        *(float *)((long)pVVar2[2].m_data + lVar10 + 4) = fVar17;
        *(undefined8 *)((long)pVVar2[2].m_data + lVar10 + 8) = 0x3f80000000000000;
        lVar10 = lVar10 + 0x30;
        bVar8 = (bool)(bVar8 ^ 1);
      }
      this->m_viewportW = local_138;
      this->m_viewportH = iStack_134;
      this->m_iterNdx = 0;
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return extraout_EAX;
    }
    glu::ShaderProgram::~ShaderProgram(pSVar6);
    operator_delete(pSVar6,0xd0);
    this->m_program = (ShaderProgram *)0x0;
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"Compile failed",(allocator<char> *)&local_158);
    tcu::TestError::TestError(this_01,(string *)&local_100);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pNVar7 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"Too small render target",(allocator<char> *)&local_158);
  tcu::NotSupportedError::NotSupportedError(pNVar7,(string *)&local_100);
  __cxa_throw(pNVar7,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void VertexIDCase::init (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const int				width		= m_context.getRenderTarget().getWidth();
	const int				height		= m_context.getRenderTarget().getHeight();

	const int				quadWidth	= 32;
	const int				quadHeight	= 32;

	if (width < quadWidth)
		throw tcu::NotSupportedError("Too small render target");

	const int				maxQuadsX	= width/quadWidth;
	const int				numVertices	= MAX_VERTICES;

	const int				numQuads	= numVertices/6 + (numVertices%6 != 0 ? 1 : 0);
	const int				viewportW	= de::min(numQuads, maxQuadsX)*quadWidth;
	const int				viewportH	= (numQuads/maxQuadsX + (numQuads%maxQuadsX != 0 ? 1 : 0))*quadHeight;

	if (viewportH > height)
		throw tcu::NotSupportedError("Too small render target");

	DE_ASSERT(viewportW <= width && viewportH <= height);

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"out mediump vec4 v_color;\n"
		"uniform highp vec4 u_colors[24];\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_color = u_colors[gl_VertexID];\n"
		"}\n",

		"#version 300 es\n"
		"in mediump vec4 v_color;\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"void main (void)\n"
		"{\n"
		"	o_color = v_color;\n"
		"}\n"));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		delete m_program;
		m_program = DE_NULL;
		throw tcu::TestError("Compile failed");
	}

	gl.genBuffers(1, &m_positionBuffer);
	gl.genBuffers(1, &m_elementBuffer);

	// Set colors (in dynamic memory to save static data space).
	m_colors.resize(numVertices);
	m_colors[ 0] = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);
	m_colors[ 1] = tcu::Vec4(0.5f, 1.0f, 0.5f, 1.0f);
	m_colors[ 2] = tcu::Vec4(0.0f, 0.5f, 1.0f, 1.0f);
	m_colors[ 3] = tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	m_colors[ 4] = tcu::Vec4(0.0f, 1.0f, 1.0f, 1.0f);
	m_colors[ 5] = tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f);
	m_colors[ 6] = tcu::Vec4(0.5f, 0.0f, 1.0f, 1.0f);
	m_colors[ 7] = tcu::Vec4(0.5f, 0.0f, 0.5f, 1.0f);
	m_colors[ 8] = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	m_colors[ 9] = tcu::Vec4(0.5f, 1.0f, 0.0f, 1.0f);
	m_colors[10] = tcu::Vec4(0.0f, 0.5f, 0.0f, 1.0f);
	m_colors[11] = tcu::Vec4(0.5f, 1.0f, 1.0f, 1.0f);
	m_colors[12] = tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	m_colors[13] = tcu::Vec4(1.0f, 0.0f, 0.5f, 1.0f);
	m_colors[14] = tcu::Vec4(0.0f, 0.5f, 0.5f, 1.0f);
	m_colors[15] = tcu::Vec4(1.0f, 1.0f, 0.5f, 1.0f);
	m_colors[16] = tcu::Vec4(1.0f, 0.0f, 1.0f, 1.0f);
	m_colors[17] = tcu::Vec4(1.0f, 0.5f, 0.0f, 1.0f);
	m_colors[18] = tcu::Vec4(0.0f, 1.0f, 0.5f, 1.0f);
	m_colors[19] = tcu::Vec4(1.0f, 0.5f, 1.0f, 1.0f);
	m_colors[20] = tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	m_colors[21] = tcu::Vec4(1.0f, 0.5f, 0.5f, 1.0f);
	m_colors[22] = tcu::Vec4(0.0f, 0.0f, 0.5f, 1.0f);
	m_colors[23] = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);

	// Compute positions.
	m_positions.resize(numVertices);
	DE_ASSERT(numVertices%3 == 0);
	for (int vtxNdx = 0; vtxNdx < numVertices; vtxNdx += 3)
	{
		const float	h			= 2.0f * float(quadHeight)/float(viewportH);
		const float	w			= 2.0f * float(quadWidth)/float(viewportW);

		const int	triNdx		= vtxNdx/3;
		const int	quadNdx		= triNdx/2;
		const int	quadY		= quadNdx/maxQuadsX;
		const int	quadX		= quadNdx%maxQuadsX;

		const float	x0			= -1.0f + float(quadX)*w;
		const float	y0			= -1.0f + float(quadY)*h;

		if (triNdx%2 == 0)
		{
			m_positions[vtxNdx+0] = tcu::Vec4(x0,   y0,   0.0f, 1.0f);
			m_positions[vtxNdx+1] = tcu::Vec4(x0+w, y0+h, 0.0f, 1.0f);
			m_positions[vtxNdx+2] = tcu::Vec4(x0,   y0+h, 0.0f, 1.0f);
		}
		else
		{
			m_positions[vtxNdx+0] = tcu::Vec4(x0+w, y0+h, 0.0f, 1.0f);
			m_positions[vtxNdx+1] = tcu::Vec4(x0,   y0,   0.0f, 1.0f);
			m_positions[vtxNdx+2] = tcu::Vec4(x0+w, y0,   0.0f, 1.0f);
		}
	}

	m_viewportW	= viewportW;
	m_viewportH	= viewportH;
	m_iterNdx	= 0;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}